

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O2

int ddGroupSiftingBackward(DdManager *table,Move *moves,int size,int upFlag,int lazyFlag)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Move *pMVar9;
  DdSubtable *pDVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  Move *pMVar14;
  ulong uVar15;
  Move *pMVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  bool bVar20;
  
  if (lazyFlag == 0) {
    pMVar16 = (Move *)0x0;
    for (pMVar9 = moves; pMVar9 != (Move *)0x0; pMVar9 = pMVar9->next) {
      if (pMVar9->size < size) {
        size = pMVar9->size;
      }
    }
  }
  else {
    pMVar16 = (Move *)0x0;
    for (pMVar9 = moves; pMVar9 != (Move *)0x0; pMVar9 = pMVar9->next) {
      iVar2 = pMVar9->size;
      pMVar14 = pMVar16;
      if (pMVar16 == (Move *)0x0) {
        pMVar14 = pMVar9;
      }
      if (iVar2 != size) {
        pMVar14 = pMVar16;
      }
      pMVar16 = pMVar14;
      if (iVar2 < size) {
        size = iVar2;
        pMVar16 = pMVar9;
      }
    }
    if (moves != (Move *)0x0) {
      iVar2 = Cudd_ReadSize(table);
      iVar2 = iVar2 + 1;
      piVar1 = table->perm;
      iVar3 = Cudd_bddReadPairIndex(table,table->invperm[(&moves->x)[upFlag != 1]]);
      uVar6 = piVar1[iVar3];
      for (pMVar9 = moves; pMVar9 != (Move *)0x0; pMVar9 = pMVar9->next) {
        if (pMVar9->size == size) {
          uVar7 = (&pMVar9->x)[upFlag != 1];
          iVar3 = uVar6 - uVar7;
          if (uVar6 < uVar7) {
            iVar3 = -(uVar6 - uVar7);
          }
          if (iVar3 < iVar2) {
            pMVar16 = pMVar9;
            iVar2 = iVar3;
          }
        }
      }
    }
  }
  do {
    iVar2 = 1;
    if (moves == (Move *)0x0) {
      return 1;
    }
    if (lazyFlag == 0) {
      if (moves->size == size) {
        return 1;
      }
    }
    else if (moves == pMVar16) {
      return 1;
    }
    pDVar10 = table->subtables;
    uVar6 = moves->x;
    uVar18 = (ulong)uVar6;
    if ((pDVar10[uVar18].next == uVar6) && (uVar7 = moves->y, pDVar10[uVar7].next == uVar7)) {
      iVar2 = cuddSwapInPlace(table,uVar6,uVar7);
      if (iVar2 == 0) {
        return 0;
      }
    }
    else {
      uVar7 = moves->y;
      uVar15 = (ulong)uVar7;
      if (moves->flags == 8) {
        do {
          uVar11 = (uint)uVar15;
          uVar8 = pDVar10[(int)uVar11].next;
          uVar15 = (ulong)uVar8;
        } while (uVar11 < uVar8);
        pDVar10[(int)uVar11].next = uVar7;
      }
      else {
        uVar8 = pDVar10[(int)uVar6].next;
        uVar13 = uVar15;
        do {
          uVar11 = (uint)uVar13;
          uVar13 = (ulong)pDVar10[(int)uVar11].next;
        } while (uVar11 < pDVar10[(int)uVar11].next);
        iVar4 = uVar6 - uVar8;
        iVar17 = uVar11 - uVar7;
        iVar3 = iVar4 + 1;
        if (iVar4 + 1 < 1) {
          iVar3 = 0;
        }
        iVar12 = -1;
        if (-1 < iVar17) {
          iVar12 = iVar17;
        }
        for (; iVar19 = iVar3, iVar2 != iVar12 + 2; iVar2 = iVar2 + 1) {
          while (bVar20 = iVar19 != 0, iVar19 = iVar19 + -1, bVar20) {
            iVar5 = cuddSwapInPlace(table,(int)uVar18,(int)uVar15);
            if (iVar5 == 0) {
              return 0;
            }
            uVar6 = cuddNextLow(table,(int)uVar18);
            uVar15 = uVar18;
            uVar18 = (ulong)uVar6;
          }
          uVar15 = (ulong)(iVar2 + uVar7);
          uVar6 = cuddNextLow(table,iVar2 + uVar7);
          uVar18 = (ulong)uVar6;
        }
        uVar6 = uVar8;
        if (iVar17 < 1) {
          iVar17 = 0;
        }
        while( true ) {
          if (iVar17 == 0) break;
          uVar7 = cuddNextHigh(table,uVar6);
          table->subtables[(int)uVar6].next = uVar7;
          uVar6 = cuddNextHigh(table,uVar6);
          iVar17 = iVar17 + -1;
        }
        table->subtables[(int)uVar6].next = uVar8;
        uVar8 = cuddNextHigh(table,uVar6);
        uVar6 = uVar8;
        if (iVar4 < 1) {
          iVar4 = 0;
        }
        while (bVar20 = iVar4 != 0, iVar4 = iVar4 + -1, bVar20) {
          uVar7 = cuddNextHigh(table,uVar6);
          table->subtables[(int)uVar6].next = uVar7;
          uVar6 = cuddNextHigh(table,uVar6);
        }
        pDVar10 = table->subtables;
      }
      pDVar10[(int)uVar6].next = uVar8;
    }
    moves = moves->next;
  } while( true );
}

Assistant:

static int
ddGroupSiftingBackward(
  DdManager * table,
  Move * moves,
  int  size,
  int  upFlag,
  int  lazyFlag)
{
    Move *move;
    int  res;
    Move *end_move = NULL;
    int diff, tmp_diff;
    int index;
    unsigned int pairlev;

    if (lazyFlag) {
        end_move = NULL;

        /* Find the minimum size, and the earliest position at which it
        ** was achieved. */
        for (move = moves; move != NULL; move = move->next) {
            if (move->size < size) {
                size = move->size;
                end_move = move;
            } else if (move->size == size) {
                if (end_move == NULL) end_move = move;
            }
        }

        /* Find among the moves that give minimum size the one that
        ** minimizes the distance from the corresponding variable. */
        if (moves != NULL) {
            diff = Cudd_ReadSize(table) + 1;
            index = (upFlag == 1) ?
                    table->invperm[moves->x] : table->invperm[moves->y];
            pairlev =
                (unsigned) table->perm[Cudd_bddReadPairIndex(table, index)];

            for (move = moves; move != NULL; move = move->next) {
                if (move->size == size) {
                    if (upFlag == 1) {
                        tmp_diff = (move->x > pairlev) ?
                                    move->x - pairlev : pairlev - move->x;
                    } else {
                        tmp_diff = (move->y > pairlev) ?
                                    move->y - pairlev : pairlev - move->y;
                    }
                    if (tmp_diff < diff) {
                        diff = tmp_diff;
                        end_move = move;
                    }
                }
            }
        }
    } else {
        /* Find the minimum size. */
        for (move = moves; move != NULL; move = move->next) {
            if (move->size < size) {
                size = move->size;
            }
        }
    }

    /* In case of lazy sifting, end_move identifies the position at
    ** which we want to stop.  Otherwise, we stop as soon as we meet
    ** the minimum size. */
    for (move = moves; move != NULL; move = move->next) {
        if (lazyFlag) {
            if (move == end_move) return(1);
        } else {
            if (move->size == size) return(1);
        }
        if ((table->subtables[move->x].next == move->x) &&
        (table->subtables[move->y].next == move->y)) {
            res = cuddSwapInPlace(table,(int)move->x,(int)move->y);
            if (!res) return(0);
#ifdef DD_DEBUG
            if (pr > 0) (void) fprintf(table->out,"ddGroupSiftingBackward:\n");
            assert(table->subtables[move->x].next == move->x);
            assert(table->subtables[move->y].next == move->y);
#endif
        } else { /* Group move necessary */
            if (move->flags == MTR_NEWNODE) {
                ddDissolveGroup(table,(int)move->x,(int)move->y);
            } else {
                res = ddGroupMoveBackward(table,(int)move->x,(int)move->y);
                if (!res) return(0);
            }
        }

    }

    return(1);

}